

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,Real beta)

{
  undefined8 uVar1;
  pointer puVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  long *plVar4;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  uint uVar5;
  MLEBABecLap *pMVar6;
  ulong uVar7;
  FabType FVar8;
  EBFArrayBoxFactory *this_01;
  pointer *ppbVar9;
  ulong uVar10;
  long lVar11;
  uint32_t *puVar12;
  long lVar13;
  long lVar14;
  int mglev;
  long lVar15;
  element_type *peVar16;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Periodicity PVar22;
  int ncomp;
  int ngrow;
  MFIter mfi;
  uint local_27c;
  FabArray<amrex::EBCellFlagFab> *local_278;
  long local_270;
  Location local_264;
  long local_260;
  MLEBABecLap *local_258;
  long local_250;
  long local_248;
  ulong local_240;
  long local_238;
  ulong local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  Box local_204;
  undefined1 local_1e8 [80];
  Array4<double> local_198;
  Real local_158;
  ulong local_150;
  long local_148;
  long local_140;
  long local_138;
  ulong local_130;
  undefined1 local_128 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_118;
  int local_100;
  Vector<int,_std::allocator<int>_> *local_e8;
  Array4<const_double> local_c8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_1e8._64_8_ = phi;
  local_158 = beta;
  local_27c = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_264 = this->m_phi_loc;
  lVar11 = (long)amrlev;
  local_260 = lVar11;
  local_258 = this;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_198.p._0_4_ = (uint)(local_264 == CellCentroid);
    local_128._1_7_ = 0;
    local_128[0] = 1;
    local_128._8_4_ = 0;
    local_128._12_4_ = 0;
    vStack_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)local_1e8,
               *(DistributionMapping **)
                &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               *(int **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar11].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(int *)&local_27c,(MFInfo *)(local_1e8 + 0x50),
               (FabFactory<amrex::FArrayBox> *)local_128);
    uVar1 = local_1e8._0_8_;
    puVar2 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e8._0_8_ = (double *)0x0;
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar2[lVar11]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar2[lVar11]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar1;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((double *)local_1e8._0_8_ != (double *)0x0) {
      (**(code **)((long)*(double *)local_1e8._0_8_ + 8))();
    }
    local_1e8._0_8_ = (MultiFab *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_118);
  }
  peVar16 = (element_type *)(local_260 * 0x18);
  if (**(long **)((long)&(((local_258->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(&(peVar16->bbox).smallend + -2)) == 0) {
    lVar13 = 0;
    lVar11 = 0;
    for (lVar15 = 0; pMVar6 = local_258,
        lVar15 < (local_258->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_260]; lVar15 = lVar15 + 1) {
      local_198.p._0_4_ = 0;
      local_128._1_7_ = 0;
      local_128[0] = 1;
      vStack_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._8_4_ = 0;
      local_128._12_4_ = 0;
      vStack_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)local_1e8,
                 (DistributionMapping *)
                 (*(long *)((long)&(((local_258->super_MLCellABecLap).super_MLCellLinOp.
                                     super_MLLinOp.m_grids.
                                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)(&(peVar16->bbox).smallend + -2)) + lVar11),
                 (int *)(*(long *)((long)&(((local_258->super_MLCellABecLap).super_MLCellLinOp.
                                            super_MLLinOp.m_dmap.
                                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ).
                                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (long)(&(peVar16->bbox).smallend + -2)) + lVar13),
                 (int *)&local_27c,(MFInfo *)(local_1e8 + 0x50),
                 (FabFactory<amrex::FArrayBox> *)local_128);
      uVar1 = local_1e8._0_8_;
      lVar14 = *(long *)((long)&(((pMVar6->m_eb_b_coeffs).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                ).
                                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (long)(&(peVar16->bbox).smallend + -2));
      local_1e8._0_8_ = (double *)0x0;
      plVar4 = *(long **)(lVar14 + lVar15 * 8);
      *(undefined8 *)(lVar14 + lVar15 * 8) = uVar1;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      if ((double *)local_1e8._0_8_ != (double *)0x0) {
        (**(code **)((long)*(double *)local_1e8._0_8_ + 8))();
      }
      local_1e8._0_8_ = (MultiFab *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_118);
      lVar11 = lVar11 + 0x68;
      lVar13 = lVar13 + 0x10;
    }
  }
  lVar11 = **(long **)((long)&(((local_258->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                m_factory.
                                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              ).
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (long)(&(peVar16->bbox).smallend + -2));
  local_1e8._72_8_ = peVar16;
  if (lVar11 == 0) {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar11,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      local_278 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    }
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_128,(FabArrayBase *)local_1e8._64_8_,&local_44);
  do {
    if (local_100 <=
        (int)vStack_118.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      MFIter::~MFIter((MFIter *)local_128);
      if (local_264 == CellCentroid) {
        this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (local_258->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_260]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        PVar22 = Geometry::periodicity
                           (*(Geometry **)
                             ((long)&(((local_258->super_MLCellABecLap).super_MLCellLinOp.
                                       super_MLLinOp.m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ).
                                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (long)(&((Box *)(local_1e8._72_8_ + 0x18))->smallend + -2)));
        local_128[0] = (undefined1)PVar22.period.vect[0];
        local_128._1_7_ = PVar22.period.vect._1_7_;
        local_128._8_4_ = PVar22.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (Periodicity *)local_128,false);
      }
      return;
    }
    MFIter::tilebox(&local_204,(MFIter *)local_128);
    pMVar6 = local_258;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_1e8,
               (FabArray<amrex::FArrayBox> *)
               (local_258->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_260]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
               (MFIter *)local_128);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)(local_1e8 + 0x50),
               (FabArray<amrex::FArrayBox> *)
               **(undefined8 **)
                 ((long)&(((pMVar6->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(&((Box *)(local_1e8._72_8_ + 0x18))->smallend + -2)),(MFIter *)local_128);
    if (local_278 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_006638e5:
      local_250 = (long)local_204.smallend.vect[1];
      local_248 = (long)local_204.smallend.vect[2];
      local_228 = CONCAT44(local_228._4_4_,local_204.bigend.vect[2]);
      uVar5 = local_27c;
      if ((int)local_27c < 1) {
        uVar5 = 0;
      }
      local_240 = (ulong)uVar5;
      local_238 = (long)local_204.smallend.vect[0] * 8;
      local_270 = 0;
      uVar7 = 0;
      while (uVar10 = uVar7, lVar11 = local_248, uVar10 != local_240) {
        while (lVar15 = lVar11, (int)lVar15 <= local_204.bigend.vect[2]) {
          local_218 = (long)(int)local_1e8._36_4_;
          local_220 = (long)(int)local_1e8._40_4_;
          lVar13 = local_198.nstride * local_270 +
                   (local_250 - local_198.begin.y) * local_198.jstride * 8 +
                   (lVar15 - local_198.begin.z) * local_198.kstride * 8 +
                   (long)local_198.begin.x * -8 +
                   CONCAT44(local_198.p._4_4_,(uint)local_198.p) + local_238;
          lVar14 = local_1e8._0_8_ +
                   local_1e8._24_8_ * local_270 +
                   (local_250 - local_218) * local_1e8._8_8_ * 8 +
                   (lVar15 - local_220) * local_1e8._16_8_ * 8 + (long)(int)local_1e8._32_4_ * -8 +
                   local_238;
          for (lVar11 = local_250; lVar11 <= local_204.bigend.vect[1]; lVar11 = lVar11 + 1) {
            if (local_204.smallend.vect[0] <= local_204.bigend.vect[0]) {
              lVar17 = 0;
              do {
                *(undefined8 *)(lVar14 + lVar17 * 8) = 0;
                *(undefined8 *)(lVar13 + lVar17 * 8) = 0;
                lVar17 = lVar17 + 1;
              } while ((local_204.bigend.vect[0] - local_204.smallend.vect[0]) + 1 != (int)lVar17);
            }
            lVar13 = lVar13 + local_198.jstride * 8;
            lVar14 = lVar14 + local_1e8._8_8_ * 8;
          }
          local_210 = lVar15;
          lVar11 = lVar15 + 1;
        }
        local_270 = local_270 + 8;
        local_230 = uVar10;
        uVar7 = uVar10 + 1;
      }
    }
    else {
      ppbVar9 = &vStack_118.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_e8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar9 = (pointer *)
                  ((local_e8->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)vStack_118.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      FVar8 = EBCellFlagFab::getType
                        ((local_278->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar9],&local_204);
      if ((uint)(FVar8 + singlevalued) < 2) goto LAB_006638e5;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_c8,(FabArray<amrex::FArrayBox> *)local_1e8._64_8_,(MFIter *)local_128);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_88,local_278,(MFIter *)local_128);
      local_218 = (long)local_204.smallend.vect[0];
      local_138 = (long)local_204.smallend.vect[1];
      local_148 = (long)local_204.smallend.vect[2];
      local_248 = CONCAT44(local_248._4_4_,local_204.bigend.vect[2]);
      local_210 = (long)local_204.bigend.vect[1];
      uVar5 = local_27c;
      if ((int)local_27c < 1) {
        uVar5 = 0;
      }
      local_150 = (ulong)uVar5;
      local_240 = local_218 * 8;
      local_140 = local_218 * 4;
      local_250 = 0;
      local_238 = CONCAT44(local_238._4_4_,local_204.bigend.vect[0]);
      for (local_130 = 0; lVar11 = local_148, local_130 != local_150; local_130 = local_130 + 1) {
        while (lVar15 = lVar11, (int)lVar15 <= local_204.bigend.vect[2]) {
          local_230 = local_88.jstride * 4;
          puVar12 = (uint32_t *)
                    ((long)&local_88.p
                            [local_218 +
                             ((lVar15 - local_88.begin.z) * local_88.kstride -
                             (long)local_88.begin.x)].flag +
                    (local_138 - local_88.begin.y) * local_230);
          for (lVar11 = local_138; lVar11 <= local_210; lVar11 = lVar11 + 1) {
            if (local_204.smallend.vect[0] <= local_204.bigend.vect[0]) {
              local_220 = (long)local_c8.begin.y;
              local_228 = (long)local_c8.begin.z;
              lVar13 = 0;
              do {
                uVar18 = 0;
                uVar19 = 0;
                uVar20 = 0;
                uVar21 = 0;
                if ((puVar12[lVar13] & 3) == 1) {
                  uVar1 = *(undefined8 *)
                           ((long)local_c8.p +
                           lVar13 * 8 +
                           local_c8.nstride * local_250 +
                           (lVar11 - local_220) * local_c8.jstride * 8 +
                           (lVar15 - local_228) * local_c8.kstride * 8 + (long)local_c8.begin.x * -8
                           + local_240);
                  uVar18 = (undefined4)uVar1;
                  uVar19 = (undefined4)((ulong)uVar1 >> 0x20);
                  uVar20 = SUB84(local_158,0);
                  uVar21 = (undefined4)((ulong)local_158 >> 0x20);
                }
                *(ulong *)(local_1e8._0_8_ +
                          lVar13 * 8 +
                          local_1e8._24_8_ * local_250 +
                          (lVar11 - (int)local_1e8._36_4_) * local_1e8._8_8_ * 8 +
                          (lVar15 - (int)local_1e8._40_4_) * local_1e8._16_8_ * 8 +
                          (long)(int)local_1e8._32_4_ * -8 + local_240) = CONCAT44(uVar19,uVar18);
                *(ulong *)(local_198.nstride * local_250 +
                           (lVar11 - local_198.begin.y) * local_198.jstride * 8 +
                           (lVar15 - local_198.begin.z) * local_198.kstride * 8 +
                           (long)local_198.begin.x * -8 +
                           CONCAT44(local_198.p._4_4_,(uint)local_198.p) + local_240 + lVar13 * 8) =
                     CONCAT44(uVar21,uVar20);
                lVar13 = lVar13 + 1;
              } while ((local_204.bigend.vect[0] - local_204.smallend.vect[0]) + 1 != (int)lVar13);
            }
            puVar12 = puVar12 + local_88.jstride;
          }
          local_270 = lVar15;
          lVar11 = lVar15 + 1;
        }
        local_250 = local_250 + 8;
      }
    }
    MFIter::operator++((MFIter *)local_128);
  } while( true );
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Real beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta;
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}